

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_attach__internal(void *uuid_,void *protocol_)

{
  void *pvVar1;
  fio_defer_task_s task;
  fio_defer_task_s task_00;
  uint uVar2;
  int *piVar3;
  fio_protocol_s *old_pr;
  void *local_30;
  fio_protocol_s *protocol;
  intptr_t uuid;
  void *protocol__local;
  void *uuid__local;
  
  local_30 = protocol_;
  protocol = (fio_protocol_s *)uuid_;
  uuid = (intptr_t)protocol_;
  protocol__local = uuid_;
  if (protocol_ != (void *)0x0) {
    if (*(long *)((long)protocol_ + 0x18) == 0) {
      *(code **)((long)protocol_ + 0x18) = mock_on_ev;
    }
    if (*protocol_ == 0) {
      *(code **)protocol_ = mock_on_data;
    }
    if (*(long *)((long)protocol_ + 8) == 0) {
      *(code **)((long)protocol_ + 8) = mock_on_ev;
    }
    if (*(long *)((long)protocol_ + 0x20) == 0) {
      *(code **)((long)protocol_ + 0x20) = mock_ping;
    }
    if (*(long *)((long)protocol_ + 0x10) == 0) {
      *(code **)((long)protocol_ + 0x10) = mock_on_shutdown;
    }
    memset((void *)((long)&old_pr + 4),0,3);
    old_pr._4_4_ = old_pr._4_4_ & 0xffffff;
    *(uint *)((long)protocol_ + 0x28) = old_pr._4_4_;
  }
  if (((-1 < (long)protocol) && (uVar2 = (uint)((ulong)protocol >> 8), uVar2 < fio_data->capa)) &&
     (((ulong)protocol & 0xff) == (ulong)*(byte *)((long)fio_data + (long)(int)uVar2 * 0xa8 + 0x6d))
     ) {
    fio_lock((fio_lock_i *)((long)fio_data + (long)(int)uVar2 * 0xa8 + 0x6c));
    uVar2 = (uint)((ulong)protocol >> 8);
    if (((-1 < (long)protocol) && (uVar2 < fio_data->capa)) &&
       (((ulong)protocol & 0xff) ==
        (ulong)*(byte *)((long)fio_data + (long)(int)uVar2 * 0xa8 + 0x6d))) {
      pvVar1 = *(void **)((long)fio_data + (long)(int)uVar2 * 0xa8 + 0x58);
      *(undefined1 *)((long)fio_data + (long)(int)uVar2 * 0xa8 + 0x6f) = 1;
      *(void **)((long)fio_data + (long)(int)uVar2 * 0xa8 + 0x58) = local_30;
      *(__time_t *)((long)fio_data + (long)(int)uVar2 * 0xa8 + 0x60) = (fio_data->last_cycle).tv_sec
      ;
      fio_unlock((fio_lock_i *)((long)fio_data + (long)(int)uVar2 * 0xa8 + 0x6c));
      if (pvVar1 == (void *)0x0) {
        if (local_30 != (void *)0x0) {
          fio_poll_add((long)(int)((ulong)protocol >> 8));
        }
      }
      else {
        task.arg1 = protocol;
        task.func = deferred_on_close;
        task.arg2 = pvVar1;
        fio_defer_push_task_fn(task,&task_queue_normal);
        fio_defer_thread_signal();
        if (local_30 == (void *)0x0) {
          fio_poll_remove_fd((long)(int)((ulong)protocol >> 8));
          fio_poll_add_write((long)(int)((ulong)protocol >> 8));
        }
      }
      return 0;
    }
    fio_unlock((fio_lock_i *)((long)fio_data + (long)(int)uVar2 * 0xa8 + 0x6c));
  }
  if (local_30 != (void *)0x0) {
    task_00.arg1 = protocol;
    task_00.func = deferred_on_close;
    task_00.arg2 = local_30;
    fio_defer_push_task_fn(task_00,&task_queue_normal);
    fio_defer_thread_signal();
  }
  if (protocol == (fio_protocol_s *)0xffffffffffffffff) {
    piVar3 = __errno_location();
    *piVar3 = 9;
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x6b;
  }
  return -1;
}

Assistant:

static int fio_attach__internal(void *uuid_, void *protocol_) {
  intptr_t uuid = (intptr_t)uuid_;
  fio_protocol_s *protocol = (fio_protocol_s *)protocol_;
  if (protocol) {
    if (!protocol->on_close) {
      protocol->on_close = mock_on_ev;
    }
    if (!protocol->on_data) {
      protocol->on_data = mock_on_data;
    }
    if (!protocol->on_ready) {
      protocol->on_ready = mock_on_ev;
    }
    if (!protocol->ping) {
      protocol->ping = mock_ping;
    }
    if (!protocol->on_shutdown) {
      protocol->on_shutdown = mock_on_shutdown;
    }
    prt_meta(protocol) = (protocol_metadata_s){.rsv = 0};
  }
  if (!uuid_is_valid(uuid))
    goto invalid_uuid_unlocked;
  fio_lock(&uuid_data(uuid).protocol_lock);
  if (!uuid_is_valid(uuid)) {
    goto invalid_uuid;
  }
  fio_protocol_s *old_pr = uuid_data(uuid).protocol;
  uuid_data(uuid).open = 1;
  uuid_data(uuid).protocol = protocol;
  touchfd(fio_uuid2fd(uuid));
  fio_unlock(&uuid_data(uuid).protocol_lock);
  if (old_pr) {
    /* protocol replacement */
    fio_defer_push_task(deferred_on_close, (void *)uuid, old_pr);
    if (!protocol) {
      /* hijacking */
      fio_poll_remove_fd(fio_uuid2fd(uuid));
      fio_poll_add_write(fio_uuid2fd(uuid));
    }
  } else if (protocol) {
    /* adding a new uuid to the reactor */
    fio_poll_add(fio_uuid2fd(uuid));
  }
  return 0;

invalid_uuid:
  fio_unlock(&uuid_data(uuid).protocol_lock);
invalid_uuid_unlocked:
  // FIO_LOG_DEBUG("fio_attach failed for invalid uuid %p", (void *)uuid);
  if (protocol)
    fio_defer_push_task(deferred_on_close, (void *)uuid, protocol);
  if (uuid == -1)
    errno = EBADF;
  else
    errno = ENOTCONN;
  return -1;
}